

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_1_multiplicative_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_MUL,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  G->val[-2] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_multiplicative_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define r G->val[-1]
#define l G->val[-2]
  yyprintf((stderr, "do yy_1_multiplicative_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
            yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_MUL, l, r);\n\
            l = yy;\n\
        }\n"));
  
            yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_MUL, l, r);
            l = yy;
        ;
#undef r
#undef l
}